

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib_base.c
# Opt level: O0

int lj_ffh_assert(lua_State *L)

{
  GCstr *pGVar1;
  lua_State *L_local;
  
  lj_lib_checkany(L,1);
  if (L->top == L->base + 1) {
    lj_err_caller(L,LJ_ERR_ASSERT);
  }
  if (((int)L->base[1].field_4.it >> 0xf != -5) &&
     (0xfffffff2 < (uint)((int)L->base[1].field_4.it >> 0xf))) {
    lj_err_run(L);
  }
  pGVar1 = lj_lib_checkstr(L,2);
  lj_err_callermsg(L,(char *)(pGVar1 + 1));
}

Assistant:

LJLIB_ASM(assert)		LJLIB_REC(.)
{
  lj_lib_checkany(L, 1);
  if (L->top == L->base+1)
    lj_err_caller(L, LJ_ERR_ASSERT);
  else if (tvisstr(L->base+1) || tvisnumber(L->base+1))
    lj_err_callermsg(L, strdata(lj_lib_checkstr(L, 2)));
  else
    lj_err_run(L);
  return FFH_UNREACHABLE;
}